

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O0

PAL_ERROR CorUnix::InternalCreateProcess
                    (CPalThread *pThread,LPCWSTR lpApplicationName,LPWSTR lpCommandLine,
                    LPSECURITY_ATTRIBUTES lpProcessAttributes,
                    LPSECURITY_ATTRIBUTES lpThreadAttributes,BOOL bInheritHandles,
                    DWORD dwCreationFlags,LPVOID lpEnvironment,LPCWSTR lpCurrentDirectory,
                    LPSTARTUPINFOW lpStartupInfo,LPPROCESS_INFORMATION lpProcessInformation)

{
  PAL_ERROR PVar1;
  BOOL BVar2;
  int iVar3;
  ssize_t sVar4;
  int *piVar5;
  long in_FS_OFFSET;
  ssize_t read_ret;
  undefined1 local_1d0 [7];
  BYTE resume_code;
  sigset_t sm;
  int local_148;
  int pipe_descs [2];
  uint EnvironmentEntries;
  uint i;
  int local_130;
  int local_12c;
  int parent_blocking_pipe;
  int child_blocking_pipe;
  char **EnvironmentArray;
  int iRet;
  UINT nArg;
  char **lppArgv;
  char *lpFileName;
  pid_t processId;
  int iFdErr;
  IPalObject *pobjFileErr;
  IPalObject *pIStack_f0;
  int iFdOut;
  IPalObject *pobjFileOut;
  IPalObject *pIStack_e0;
  int iFdIn;
  IPalObject *pobjFileIn;
  CObjectAttributes oa;
  HANDLE hProcess;
  HANDLE hDummyThread;
  CPalThread *pDummyThread;
  IDataLock *pSharedDataLock;
  CProcProcessLocalData *pLocalData;
  IDataLock *pLocalDataLock;
  IPalObject *pobjProcessRegistered;
  IPalObject *pobjProcess;
  PAL_ERROR palError;
  BOOL bInheritHandles_local;
  LPSECURITY_ATTRIBUTES lpThreadAttributes_local;
  LPSECURITY_ATTRIBUTES lpProcessAttributes_local;
  LPWSTR lpCommandLine_local;
  LPCWSTR lpApplicationName_local;
  CPalThread *pThread_local;
  PathCharString lpFileNamePS;
  
  lpFileNamePS.m_count = *(SIZE_T *)(in_FS_OFFSET + 0x28);
  pobjProcess._0_4_ = 0;
  pobjProcessRegistered = (IPalObject *)0x0;
  pLocalDataLock = (IDataLock *)0x0;
  pLocalData = (CProcProcessLocalData *)0x0;
  pDummyThread = (CPalThread *)0x0;
  hDummyThread = (HANDLE)0x0;
  hProcess = (HANDLE)0x0;
  oa.pSecurityAttributes = (LPSECURITY_ATTRIBUTES)0x0;
  pobjProcess._4_4_ = bInheritHandles;
  _palError = lpThreadAttributes;
  lpThreadAttributes_local = lpProcessAttributes;
  lpProcessAttributes_local = (LPSECURITY_ATTRIBUTES)lpCommandLine;
  lpCommandLine_local = lpApplicationName;
  lpApplicationName_local = (LPCWSTR)pThread;
  CObjectAttributes::CObjectAttributes
            ((CObjectAttributes *)&pobjFileIn,(WCHAR *)0x0,lpProcessAttributes);
  pIStack_e0 = (IPalObject *)0x0;
  pobjFileOut._4_4_ = -1;
  pIStack_f0 = (IPalObject *)0x0;
  pobjFileErr._4_4_ = -1;
  _processId = (IPalObject *)0x0;
  lpFileName._4_4_ = -1;
  StackString<32UL,_char>::StackString((StackString<32UL,_char> *)&pThread_local);
  _iRet = (char **)0x0;
  _parent_blocking_pipe = (char **)0x0;
  local_12c = -1;
  local_130 = -1;
  if (lpCommandLine_local == (LPWSTR)0x0) {
    if ((dwCreationFlags & 0xffffffeb) == 0) {
      if ((lpThreadAttributes_local == (LPSECURITY_ATTRIBUTES)0x0) ||
         ((lpThreadAttributes_local->lpSecurityDescriptor == (LPVOID)0x0 &&
          (lpThreadAttributes_local->bInheritHandle == 1)))) {
        if (_palError == (LPSECURITY_ATTRIBUTES)0x0) {
          if (lpStartupInfo == (LPSTARTUPINFOW)0x0) {
            if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
              abort();
            }
            pobjProcess._0_4_ = 0x57;
          }
          else if (lpStartupInfo->cb < 0x68) {
            fprintf(_stderr,"] %s %s:%d","InternalCreateProcess",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/process.cpp"
                    ,0x24a);
            fprintf(_stderr,"lpStartupInfo parameter structure size is invalid (%u)\n",
                    (ulong)lpStartupInfo->cb);
            pobjProcess._0_4_ = 0x57;
          }
          else if ((lpStartupInfo->dwFlags & 0xfffffeff) == 0) {
            if ((lpStartupInfo->dwFlags & 0x100) != 0) {
              pobjProcess._0_4_ =
                   PrepareStandardHandle
                             ((CPalThread *)lpApplicationName_local,lpStartupInfo->hStdInput,
                              &stack0xffffffffffffff20,(int *)((long)&pobjFileOut + 4));
              if ((((PAL_ERROR)pobjProcess != 0) ||
                  (pobjProcess._0_4_ =
                        PrepareStandardHandle
                                  ((CPalThread *)lpApplicationName_local,lpStartupInfo->hStdOutput,
                                   &stack0xffffffffffffff10,(int *)((long)&pobjFileErr + 4)),
                  (PAL_ERROR)pobjProcess != 0)) ||
                 (pobjProcess._0_4_ =
                       PrepareStandardHandle
                                 ((CPalThread *)lpApplicationName_local,lpStartupInfo->hStdError,
                                  (IPalObject **)&processId,(int *)((long)&lpFileName + 4)),
                 (PAL_ERROR)pobjProcess != 0)) goto LAB_00255ee6;
              pobjProcess._0_4_ = 0;
            }
            lppArgv = (char **)StackString<32UL,_char>::OpenStringBuffer
                                         ((StackString<32UL,_char> *)&pThread_local,0x3ff);
            if (lppArgv == (char **)0x0) {
              pobjProcess._0_4_ = 8;
            }
            else {
              BVar2 = getFileName(lpCommandLine_local,(LPWSTR)lpProcessAttributes_local,
                                  (char *)lppArgv);
              if (BVar2 == 0) {
                if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                  abort();
                }
                pobjProcess._0_4_ = 2;
              }
              else {
                StackString<32UL,_char>::CloseBuffer
                          ((StackString<32UL,_char> *)&pThread_local,0x3ff);
                EnvironmentArray._0_4_ = checkFileType((LPCSTR)lppArgv);
                if ((int)EnvironmentArray == 0) {
                  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                    abort();
                  }
                  pobjProcess._0_4_ = 2;
                }
                else if ((int)EnvironmentArray == 1) {
                  _iRet = buildArgv((LPCWSTR)lpProcessAttributes_local,(LPSTR)lppArgv,
                                    (UINT *)((long)&EnvironmentArray + 4));
                  if (lpEnvironment != (LPVOID)0x0) {
                    pipe_descs[0] = 0;
                    for (pipe_descs[1] = 0;
                        *(char *)((long)lpEnvironment + (ulong)(uint)pipe_descs[1]) != '\0';
                        pipe_descs[1] = pipe_descs[1] + 1) {
                      pipe_descs[0] = pipe_descs[0] + 1;
                      for (; *(char *)((long)lpEnvironment + (ulong)(uint)pipe_descs[1]) != '\0';
                          pipe_descs[1] = pipe_descs[1] + 1) {
                      }
                    }
                    _parent_blocking_pipe = (char **)InternalMalloc((ulong)(pipe_descs[0] + 1) << 3)
                    ;
                    pipe_descs[0] = 0;
                    for (pipe_descs[1] = 0;
                        *(char *)((long)lpEnvironment + (ulong)(uint)pipe_descs[1]) != '\0';
                        pipe_descs[1] = pipe_descs[1] + 1) {
                      _parent_blocking_pipe[(uint)pipe_descs[0]] =
                           (char *)((long)lpEnvironment + (ulong)(uint)pipe_descs[1]);
                      pipe_descs[0] = pipe_descs[0] + 1;
                      for (; *(char *)((long)lpEnvironment + (ulong)(uint)pipe_descs[1]) != '\0';
                          pipe_descs[1] = pipe_descs[1] + 1) {
                      }
                    }
                    _parent_blocking_pipe[(uint)pipe_descs[0]] = (char *)0x0;
                  }
                  pobjProcess._0_4_ =
                       (**(code **)*g_pObjectManager)
                                 (g_pObjectManager,lpApplicationName_local,otProcess,&pobjFileIn,
                                  &pobjProcessRegistered);
                  if ((PAL_ERROR)pobjProcess == 0) {
                    pobjProcess._0_4_ =
                         (**(code **)(*g_pObjectManager + 8))
                                   (g_pObjectManager,lpApplicationName_local,pobjProcessRegistered,
                                    &aotProcess,"S_11HeapBucketTIS2_EE",&oa.pSecurityAttributes,
                                    &pLocalDataLock);
                    pobjProcessRegistered = (IPalObject *)0x0;
                    if ((PAL_ERROR)pobjProcess == 0) {
                      pobjProcess._0_4_ =
                           InternalCreateDummyThread
                                     ((CPalThread *)lpApplicationName_local,_palError,
                                      (CPalThread **)&hDummyThread,&hProcess);
                      if ((dwCreationFlags & 4) != 0) {
                        iVar3 = pipe((int *)((long)sm.__val + 0x7c));
                        if (iVar3 == -1) {
                          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                            abort();
                          }
                          piVar5 = __errno_location();
                          strerror(*piVar5);
                          pobjProcess._0_4_ = 8;
                          goto LAB_00255ee6;
                        }
                        CThreadSuspensionInfo::SetBlockingPipe
                                  ((CThreadSuspensionInfo *)((long)hDummyThread + 0x488),local_148);
                        local_130 = local_148;
                        local_12c = sm.__val[0xf]._4_4_;
                      }
                      pobjProcess._0_4_ =
                           (*pLocalDataLock->_vptr_IDataLock[3])
                                     (pLocalDataLock,lpApplicationName_local,1,&pLocalData,
                                      &pSharedDataLock);
                      if ((PAL_ERROR)pobjProcess == 0) {
                        lpFileName._0_4_ = fork();
                        if ((DWORD)lpFileName == 0xffffffff) {
                          fprintf(_stderr,"] %s %s:%d","InternalCreateProcess",
                                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/process.cpp"
                                  ,0x325);
                          fprintf(_stderr,"Unable to create a new process with fork()\n");
                          if (local_12c != -1) {
                            close(local_12c);
                            close(local_130);
                          }
                          pobjProcess._0_4_ = 0x54f;
                        }
                        else {
                          if ((DWORD)lpFileName == 0) {
                            Volatile<int>::operator=(&init_count,0);
                            sigemptyset((sigset_t *)local_1d0);
                            EnvironmentArray._0_4_ =
                                 sigprocmask(2,(sigset_t *)local_1d0,(sigset_t *)0x0);
                            if ((int)EnvironmentArray == 0) {
                              if ((dwCreationFlags & 4) == 0) {
LAB_00255c90:
                                if (lpCurrentDirectory != (LPCWSTR)0x0) {
                                  SetCurrentDirectoryW(lpCurrentDirectory);
                                }
                                if ((lpStartupInfo->dwFlags & 0x100) != 0) {
                                  iVar3 = dup2(pobjFileOut._4_4_,0);
                                  if (iVar3 == -1) {
                                    if (*(SIZE_T *)(in_FS_OFFSET + 0x28) == lpFileNamePS.m_count) {
                                      _exit(1);
                                    }
                                    goto LAB_002561ba;
                                  }
                                  iVar3 = dup2(pobjFileErr._4_4_,1);
                                  if (iVar3 == -1) {
                                    if (*(SIZE_T *)(in_FS_OFFSET + 0x28) == lpFileNamePS.m_count) {
                                      _exit(1);
                                    }
                                    goto LAB_002561ba;
                                  }
                                  iVar3 = dup2(lpFileName._4_4_,2);
                                  if (iVar3 == -1) {
                                    if (*(SIZE_T *)(in_FS_OFFSET + 0x28) == lpFileNamePS.m_count) {
                                      _exit(1);
                                    }
                                    goto LAB_002561ba;
                                  }
                                  close(pobjFileOut._4_4_);
                                  close(pobjFileErr._4_4_);
                                  close(lpFileName._4_4_);
                                }
                                if (_parent_blocking_pipe == (char **)0x0) {
                                  execve((char *)lppArgv,_iRet,palEnvironment);
                                }
                                else {
                                  execve((char *)lppArgv,_iRet,_parent_blocking_pipe);
                                }
                                if (*(SIZE_T *)(in_FS_OFFSET + 0x28) == lpFileNamePS.m_count) {
                                  _exit(1);
                                }
                              }
                              else {
                                read_ret._7_1_ = '\0';
                                close(local_130);
                                do {
                                  sVar4 = read(local_12c,(void *)((long)&read_ret + 7),1);
                                  if (sVar4 == 1) {
                                    if (read_ret._7_1_ == '*') {
                                      close(local_12c);
                                      goto LAB_00255c90;
                                    }
                                    if (*(SIZE_T *)(in_FS_OFFSET + 0x28) == lpFileNamePS.m_count) {
                                      _exit(1);
                                    }
                                    goto LAB_002561ba;
                                  }
                                } while ((sVar4 == -1) &&
                                        (piVar5 = __errno_location(), *piVar5 == 4));
                                if (*(SIZE_T *)(in_FS_OFFSET + 0x28) == lpFileNamePS.m_count) {
                                  _exit(1);
                                }
                              }
                            }
                            else if (*(SIZE_T *)(in_FS_OFFSET + 0x28) == lpFileNamePS.m_count) {
                              _exit(1);
                            }
                            goto LAB_002561ba;
                          }
                          close(local_12c);
                          *(DWORD *)&pSharedDataLock->_vptr_IDataLock = (DWORD)lpFileName;
                          (*(code *)**(undefined8 **)pLocalData)
                                    (pLocalData,lpApplicationName_local,1);
                          pLocalData = (CProcProcessLocalData *)0x0;
                          if ((lpStartupInfo->dwFlags & 0x100) != 0) {
                            (*pIStack_e0->_vptr_IPalObject[8])(pIStack_e0,lpApplicationName_local);
                            pIStack_e0 = (IPalObject *)0x0;
                            (*pIStack_f0->_vptr_IPalObject[8])(pIStack_f0,lpApplicationName_local);
                            pIStack_f0 = (IPalObject *)0x0;
                            (*_processId->_vptr_IPalObject[8])(_processId,lpApplicationName_local);
                            _processId = (IPalObject *)0x0;
                          }
                          lpProcessInformation->hProcess = oa.pSecurityAttributes;
                          lpProcessInformation->hThread = hProcess;
                          lpProcessInformation->dwProcessId = (DWORD)lpFileName;
                          lpProcessInformation->dwThreadId_PAL_Undefined = 0;
                          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                            abort();
                          }
                        }
                      }
                      else {
                        fprintf(_stderr,"] %s %s:%d","InternalCreateProcess",
                                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/process.cpp"
                                ,0x31b);
                        fprintf(_stderr,"Unable to obtain local data for new process object\n");
                      }
                    }
                    else if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                      abort();
                    }
                  }
                  else if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                    abort();
                  }
                }
                else if ((int)EnvironmentArray == 2) {
                  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                    abort();
                  }
                  pobjProcess._0_4_ = 5;
                }
                else {
                  fprintf(_stderr,"] %s %s:%d","InternalCreateProcess",
                          "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/process.cpp"
                          ,0x2a2);
                  fprintf(_stderr,"Invalid return type from checkFileType");
                  pobjProcess._0_4_ = 2;
                }
              }
            }
          }
          else {
            fprintf(_stderr,"] %s %s:%d","InternalCreateProcess",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/process.cpp"
                    ,0x253);
            fprintf(_stderr,"lpStartupInfo parameter invalid flags (%#x)\n",
                    (ulong)lpStartupInfo->dwFlags);
            pobjProcess._0_4_ = 0x57;
          }
        }
        else {
          fprintf(_stderr,"] %s %s:%d","InternalCreateProcess",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/process.cpp"
                  ,0x239);
          fprintf(_stderr,"lpThreadAttributes parameter must be NULL (%p)\n",_palError);
          pobjProcess._0_4_ = 0x57;
        }
      }
      else {
        fprintf(_stderr,"] %s %s:%d","InternalCreateProcess",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/process.cpp"
                ,0x231);
        fprintf(_stderr,"lpProcessAttributes is invalid, parameter ignored (%p)\n",
                lpThreadAttributes_local);
        pobjProcess._0_4_ = 0x57;
      }
    }
    else {
      fprintf(_stderr,"] %s %s:%d","InternalCreateProcess",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/process.cpp"
              ,0x226);
      fprintf(_stderr,"Unexpected creation flags (%#x)\n",(ulong)dwCreationFlags);
      pobjProcess._0_4_ = 0x57;
    }
  }
  else {
    fprintf(_stderr,"] %s %s:%d","InternalCreateProcess",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/process.cpp"
            ,0x21f);
    fprintf(_stderr,"lpApplicationName should be NULL, but is %S instead\n",lpCommandLine_local);
    pobjProcess._0_4_ = 0x57;
  }
LAB_00255ee6:
  if (pLocalData != (CProcProcessLocalData *)0x0) {
    (*(code *)**(undefined8 **)pLocalData)(pLocalData,lpApplicationName_local,0);
  }
  if (pDummyThread != (CPalThread *)0x0) {
    (**pDummyThread->_vptr_CPalThread)(pDummyThread,lpApplicationName_local,0);
  }
  if (pobjProcessRegistered != (IPalObject *)0x0) {
    (*pobjProcessRegistered->_vptr_IPalObject[8])(pobjProcessRegistered,lpApplicationName_local);
  }
  if (pLocalDataLock != (IDataLock *)0x0) {
    (*pLocalDataLock->_vptr_IDataLock[8])(pLocalDataLock,lpApplicationName_local);
  }
  if ((PAL_ERROR)pobjProcess != 0) {
    if (oa.pSecurityAttributes != (LPSECURITY_ATTRIBUTES)0x0) {
      (**(code **)(*g_pObjectManager + 0x20))
                (g_pObjectManager,lpApplicationName_local,oa.pSecurityAttributes);
    }
    if (hProcess != (HANDLE)0x0) {
      (**(code **)(*g_pObjectManager + 0x20))(g_pObjectManager,lpApplicationName_local,hProcess);
    }
  }
  if (_parent_blocking_pipe != (char **)0x0) {
    ::free(_parent_blocking_pipe);
  }
  if (pIStack_e0 != (IPalObject *)0x0) {
    iVar3 = fcntl64(pobjFileOut._4_4_,2,1);
    if (iVar3 == -1) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      piVar5 = __errno_location();
      strerror(*piVar5);
    }
    (*pIStack_e0->_vptr_IPalObject[8])(pIStack_e0,lpApplicationName_local);
  }
  if (pIStack_f0 != (IPalObject *)0x0) {
    iVar3 = fcntl64(pobjFileErr._4_4_,2,1);
    if (iVar3 == -1) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      piVar5 = __errno_location();
      strerror(*piVar5);
    }
    (*pIStack_f0->_vptr_IPalObject[8])(pIStack_f0,lpApplicationName_local);
  }
  if (_processId != (IPalObject *)0x0) {
    iVar3 = fcntl64(lpFileName._4_4_,2,1);
    if (iVar3 == -1) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      piVar5 = __errno_location();
      strerror(*piVar5);
    }
    (*_processId->_vptr_IPalObject[8])(_processId,lpApplicationName_local);
  }
  if (_iRet != (char **)0x0) {
    ::free(*_iRet);
    ::free(_iRet);
  }
  PVar1 = (PAL_ERROR)pobjProcess;
  StackString<32UL,_char>::~StackString((StackString<32UL,_char> *)&pThread_local);
  if (*(SIZE_T *)(in_FS_OFFSET + 0x28) == lpFileNamePS.m_count) {
    return PVar1;
  }
LAB_002561ba:
  __stack_chk_fail();
}

Assistant:

PAL_ERROR
CorUnix::InternalCreateProcess(
    CPalThread *pThread,
    LPCWSTR lpApplicationName,
    LPWSTR lpCommandLine,
    LPSECURITY_ATTRIBUTES lpProcessAttributes,
    LPSECURITY_ATTRIBUTES lpThreadAttributes,
    BOOL bInheritHandles,
    DWORD dwCreationFlags,
    LPVOID lpEnvironment,
    LPCWSTR lpCurrentDirectory,
    LPSTARTUPINFOW lpStartupInfo,
    LPPROCESS_INFORMATION lpProcessInformation
    )
{
    PAL_ERROR palError = NO_ERROR;
    IPalObject *pobjProcess = NULL;
    IPalObject *pobjProcessRegistered = NULL;
    IDataLock *pLocalDataLock = NULL;
    CProcProcessLocalData *pLocalData;
    IDataLock *pSharedDataLock = NULL;
    CPalThread *pDummyThread = NULL;
    HANDLE hDummyThread = NULL;
    HANDLE hProcess = NULL;
    CObjectAttributes oa(NULL, lpProcessAttributes);

    IPalObject *pobjFileIn = NULL;
    int iFdIn = -1;
    IPalObject *pobjFileOut = NULL;
    int iFdOut = -1;
    IPalObject *pobjFileErr = NULL;
    int iFdErr = -1;

    pid_t processId;
    char * lpFileName;
    PathCharString lpFileNamePS;
    char **lppArgv = NULL;
    UINT nArg;
    int  iRet;
    char **EnvironmentArray=NULL;
    int child_blocking_pipe = -1;
    int parent_blocking_pipe = -1;

    /* Validate parameters */

    /* note : specs indicate lpApplicationName should always
       be NULL; however support for it is already implemented. Leaving the code
       in, specs can change; but rejecting non-NULL for now to conform to the
       spec. */
    if( NULL != lpApplicationName )
    {
        ASSERT("lpApplicationName should be NULL, but is %S instead\n",
               lpApplicationName);
        palError = ERROR_INVALID_PARAMETER;
        goto InternalCreateProcessExit;
    }

    if (0 != (dwCreationFlags & ~(CREATE_SUSPENDED|CREATE_NEW_CONSOLE)))
    {
        ASSERT("Unexpected creation flags (%#x)\n", dwCreationFlags);
        palError = ERROR_INVALID_PARAMETER;
        goto InternalCreateProcessExit;
    }

    /* Security attributes parameters are ignored */
    if (lpProcessAttributes != NULL &&
        (lpProcessAttributes->lpSecurityDescriptor != NULL ||
         lpProcessAttributes->bInheritHandle != TRUE))
    {
        ASSERT("lpProcessAttributes is invalid, parameter ignored (%p)\n",
               lpProcessAttributes);
        palError = ERROR_INVALID_PARAMETER;
        goto InternalCreateProcessExit;
    }

    if (lpThreadAttributes != NULL)
    {
        ASSERT("lpThreadAttributes parameter must be NULL (%p)\n",
               lpThreadAttributes);
        palError = ERROR_INVALID_PARAMETER;
        goto InternalCreateProcessExit;
    }

    /* note : Win32 crashes in this case */
    if(NULL == lpStartupInfo)
    {
        ERROR("lpStartupInfo is NULL\n");
        palError = ERROR_INVALID_PARAMETER;
        goto InternalCreateProcessExit;
    }

    /* Validate lpStartupInfo.cb field */
    if (lpStartupInfo->cb < sizeof(STARTUPINFOW))
    {
        ASSERT("lpStartupInfo parameter structure size is invalid (%u)\n",
              lpStartupInfo->cb);
        palError = ERROR_INVALID_PARAMETER;
        goto InternalCreateProcessExit;
    }

    /* lpStartupInfo should be either zero or STARTF_USESTDHANDLES */
    if (lpStartupInfo->dwFlags & ~STARTF_USESTDHANDLES)
    {
        ASSERT("lpStartupInfo parameter invalid flags (%#x)\n",
              lpStartupInfo->dwFlags);
        palError = ERROR_INVALID_PARAMETER;
        goto InternalCreateProcessExit;
    }

    /* validate given standard handles if we have any */
    if (lpStartupInfo->dwFlags & STARTF_USESTDHANDLES)
    {
        palError = PrepareStandardHandle(
            pThread,
            lpStartupInfo->hStdInput,
            &pobjFileIn,
            &iFdIn
            );

        if (NO_ERROR != palError)
        {
            goto InternalCreateProcessExit;
        }

        palError = PrepareStandardHandle(
            pThread,
            lpStartupInfo->hStdOutput,
            &pobjFileOut,
            &iFdOut
            );

        if (NO_ERROR != palError)
        {
            goto InternalCreateProcessExit;
        }

        palError = PrepareStandardHandle(
            pThread,
            lpStartupInfo->hStdError,
            &pobjFileErr,
            &iFdErr
            );

        if (NO_ERROR != palError)
        {
            goto InternalCreateProcessExit;
        }
    }

    lpFileName = lpFileNamePS.OpenStringBuffer(MAX_LONGPATH-1);
    if (NULL == lpFileName)
    {
        palError = ERROR_NOT_ENOUGH_MEMORY;
        goto InternalCreateProcessExit;
    }
    if (!getFileName(lpApplicationName, lpCommandLine, lpFileName))
    {
        ERROR("Can't find executable!\n");
        palError = ERROR_FILE_NOT_FOUND;
        goto InternalCreateProcessExit;
    }

    lpFileNamePS.CloseBuffer(MAX_LONGPATH-1);
    /* check type of file */
    iRet = checkFileType(lpFileName);

    switch (iRet)
    {
        case FILE_ERROR: /* file not found, or not an executable */
            WARN ("File is not valid (%s)", lpFileName);
            palError = ERROR_FILE_NOT_FOUND;
            goto InternalCreateProcessExit;

        case FILE_UNIX: /* Unix binary file */
            break;  /* nothing to do */

        case FILE_DIR:/*Directory*/
            WARN ("File is a Directory (%s)", lpFileName);
            palError = ERROR_ACCESS_DENIED;
            goto InternalCreateProcessExit;
            break;

        default: /* not supposed to get here */
            ASSERT ("Invalid return type from checkFileType");
            palError = ERROR_FILE_NOT_FOUND;
            goto InternalCreateProcessExit;
    }

    /* build Argument list, lppArgv is allocated in buildArgv function and
       requires to be freed */
    lppArgv = buildArgv(lpCommandLine, lpFileName, &nArg);

    /* set the Environment variable */
    if (lpEnvironment != NULL)
    {
        unsigned i;
        // Since CREATE_UNICODE_ENVIRONMENT isn't supported we know the string is ansi
        unsigned EnvironmentEntries = 0;
        // Convert the environment block to array of strings
        // Count the number of entries
        // Is it a string that contains null terminated string, the end is delimited
        // by two null in a row.
        for (i = 0; ((char *)lpEnvironment)[i]!='\0'; i++)
        {
            EnvironmentEntries ++;
            for (;((char *)lpEnvironment)[i]!='\0'; i++)
            {
            }
        }
        EnvironmentEntries++;
        EnvironmentArray = (char **)InternalMalloc(EnvironmentEntries * sizeof(char *));

        EnvironmentEntries = 0;
        // Convert the environment block to array of strings
        // Count the number of entries
        // Is it a string that contains null terminated string, the end is delimited
        // by two null in a row.
        for (i = 0; ((char *)lpEnvironment)[i]!='\0'; i++)
        {
            EnvironmentArray[EnvironmentEntries] = &((char *)lpEnvironment)[i];
            EnvironmentEntries ++;
            for (;((char *)lpEnvironment)[i]!='\0'; i++)
            {
            }
        }
        EnvironmentArray[EnvironmentEntries] = NULL;
    }

    //
    // Allocate and register the process object for the new process
    //

    palError = g_pObjectManager->AllocateObject(
        pThread,
        &otProcess,
        &oa,
        &pobjProcess
        );

    if (NO_ERROR != palError)
    {
        ERROR("Unable to allocate object for new process\n");
        goto InternalCreateProcessExit;
    }

    palError = g_pObjectManager->RegisterObject(
        pThread,
        pobjProcess,
        &aotProcess,
        PROCESS_ALL_ACCESS,
        &hProcess,
        &pobjProcessRegistered
        );

    //
    // pobjProcess is invalidated by the above call, so
    // NULL it out here
    //

    pobjProcess = NULL;

    if (NO_ERROR != palError)
    {
        ERROR("Unable to register new process object\n");
        goto InternalCreateProcessExit;
    }

    //
    // Create a new "dummy" thread object
    //

    palError = InternalCreateDummyThread(
        pThread,
        lpThreadAttributes,
        &pDummyThread,
        &hDummyThread
        );

    if (dwCreationFlags & CREATE_SUSPENDED)
    {
        int pipe_descs[2];

        if (-1 == pipe(pipe_descs))
        {
            ERROR("pipe() failed! error is %d (%s)\n", errno, strerror(errno));
            palError = ERROR_NOT_ENOUGH_MEMORY;
            goto InternalCreateProcessExit;
        }

        /* [0] is read end, [1] is write end */
        pDummyThread->suspensionInfo.SetBlockingPipe(pipe_descs[1]);
        parent_blocking_pipe = pipe_descs[1];
        child_blocking_pipe = pipe_descs[0];
    }

    palError = pobjProcessRegistered->GetProcessLocalData(
        pThread,
        WriteLock,
        &pLocalDataLock,
        reinterpret_cast<void **>(&pLocalData)
        );

    if (NO_ERROR != palError)
    {
        ASSERT("Unable to obtain local data for new process object\n");
        goto InternalCreateProcessExit;
    }


    /* fork the new process */
    processId = fork();

    if (processId == -1)
    {
        ASSERT("Unable to create a new process with fork()\n");
        if (-1 != child_blocking_pipe)
        {
            close(child_blocking_pipe);
            close(parent_blocking_pipe);
        }

        palError = ERROR_INTERNAL_ERROR;
        goto InternalCreateProcessExit;
    }

    /* From the time the child process begins running, to when it reaches execve,
    the child process is not a real PAL process and does not own any PAL
    resources, although it has access to the PAL resources of its parent process.
    Thus, while the child process is in this window, it is dangerous for it to affect
    its parent's PAL resources. As a consequence, no PAL code should be used
    in this window; all code should make unix calls. Note the use of _exit
    instead of exit to avoid calling PAL_Terminate and the lack of TRACE's and
    ASSERT's. */

    if (processId == 0)  /* child process */
    {
        // At this point, the PAL should be considered uninitialized for this child process.

        // Don't want to enter the init_critsec here since we're trying to avoid
        // calling PAL functions. Furthermore, nothing should be changing
        // the init_count in the child process at this point since this is the only
        // thread executing.
        init_count = 0;

        sigset_t sm;

        //
        // Clear out the signal mask for the new process.
        //

        sigemptyset(&sm);
        iRet = sigprocmask(SIG_SETMASK, &sm, NULL);
        if (iRet != 0)
        {
            _exit(EXIT_FAILURE);
        }

        if (dwCreationFlags & CREATE_SUSPENDED)
        {
            BYTE resume_code = 0;
            ssize_t read_ret;

            /* close the write end of the pipe, the child doesn't need it */
            close(parent_blocking_pipe);

            read_again:
            /* block until ResumeThread writes something to the pipe */
            read_ret = read(child_blocking_pipe, &resume_code, sizeof(resume_code));
            if (sizeof(resume_code) != read_ret)
            {
                if (read_ret == -1 && EINTR == errno)
                {
                    goto read_again;
                }
                else
                {
                    /* note : read might return 0 (and return EAGAIN) if the other
                       end of the pipe gets closed - for example because the parent
                       process dies (very) abruptly */
                    _exit(EXIT_FAILURE);
                }
            }
            if (WAKEUPCODE != resume_code)
            {
                // resume_code should always equal WAKEUPCODE.
                _exit(EXIT_FAILURE);
            }

            close(child_blocking_pipe);
        }

        /* Set the current directory */
        if (lpCurrentDirectory)
        {
            SetCurrentDirectoryW(lpCurrentDirectory);
        }

        /* Set the standard handles to the incoming values */
        if (lpStartupInfo->dwFlags & STARTF_USESTDHANDLES)
        {
            /* For each handle, we need to duplicate the incoming unix
               fd to the corresponding standard one.  The API that I use,
               dup2, will copy the source to the destination, automatically
               closing the existing destination, in an atomic way */
            if (dup2(iFdIn, STDIN_FILENO) == -1)
            {
                // Didn't duplicate standard in.
                _exit(EXIT_FAILURE);
            }

            if (dup2(iFdOut, STDOUT_FILENO) == -1)
            {
                // Didn't duplicate standard out.
                _exit(EXIT_FAILURE);
            }

            if (dup2(iFdErr, STDERR_FILENO) == -1)
            {
                // Didn't duplicate standard error.
                _exit(EXIT_FAILURE);
            }

            /* now close the original FDs, we don't need them anymore */
            close(iFdIn);
            close(iFdOut);
            close(iFdErr);
        }

        /* execute the new process */

        if (EnvironmentArray)
        {
            execve(lpFileName, lppArgv, EnvironmentArray);
        }
        else
        {
            execve(lpFileName, lppArgv, palEnvironment);
        }

        /* if we get here, it means the execve function call failed so just exit */
        _exit(EXIT_FAILURE);
    }

    /* parent process */

    /* close the read end of the pipe, the parent doesn't need it */
    close(child_blocking_pipe);

    /* Set the process ID */
    pLocalData->dwProcessId = processId;
    pLocalDataLock->ReleaseLock(pThread, TRUE);
    pLocalDataLock = NULL;

    //
    // Release file handle info; we don't need them anymore. Note that
    // this must happen after we've released the data locks, as
    // otherwise a deadlock could result.
    //

    if (lpStartupInfo->dwFlags & STARTF_USESTDHANDLES)
    {
        pobjFileIn->ReleaseReference(pThread);
        pobjFileIn = NULL;
        pobjFileOut->ReleaseReference(pThread);
        pobjFileOut = NULL;
        pobjFileErr->ReleaseReference(pThread);
        pobjFileErr = NULL;
    }

    /* fill PROCESS_INFORMATION structure */
    lpProcessInformation->hProcess = hProcess;
    lpProcessInformation->hThread = hDummyThread;
    lpProcessInformation->dwProcessId = processId;
    lpProcessInformation->dwThreadId_PAL_Undefined = 0;


    TRACE("New process created: id=%#x\n", processId);

InternalCreateProcessExit:

    if (NULL != pLocalDataLock)
    {
        pLocalDataLock->ReleaseLock(pThread, FALSE);
    }

    if (NULL != pSharedDataLock)
    {
        pSharedDataLock->ReleaseLock(pThread, FALSE);
    }

    if (NULL != pobjProcess)
    {
        pobjProcess->ReleaseReference(pThread);
    }

    if (NULL != pobjProcessRegistered)
    {
        pobjProcessRegistered->ReleaseReference(pThread);
    }

    if (NO_ERROR != palError)
    {
        if (NULL != hProcess)
        {
            g_pObjectManager->RevokeHandle(pThread, hProcess);
        }

        if (NULL != hDummyThread)
        {
            g_pObjectManager->RevokeHandle(pThread, hDummyThread);
        }
    }

    if (EnvironmentArray)
    {
        free(EnvironmentArray);
    }

    /* if we still have the file structures at this point, it means we
       encountered an error sometime between when we acquired them and when we
       fork()ed. We not only have to release them, we have to give them back
       their close-on-exec flag */
    if (NULL != pobjFileIn)
    {
        if(-1 == fcntl(iFdIn, F_SETFD, 1))
        {
            WARN("couldn't restore close-on-exec flag to stdin descriptor! "
                 "errno is %d (%s)\n", errno, strerror(errno));
        }
        pobjFileIn->ReleaseReference(pThread);
    }

    if (NULL != pobjFileOut)
    {
        if(-1 == fcntl(iFdOut, F_SETFD, 1))
        {
            WARN("couldn't restore close-on-exec flag to stdout descriptor! "
                 "errno is %d (%s)\n", errno, strerror(errno));
        }
        pobjFileOut->ReleaseReference(pThread);
    }

    if (NULL != pobjFileErr)
    {
        if(-1 == fcntl(iFdErr, F_SETFD, 1))
        {
            WARN("couldn't restore close-on-exec flag to stderr descriptor! "
                 "errno is %d (%s)\n", errno, strerror(errno));
        }
        pobjFileErr->ReleaseReference(pThread);
    }

    /* free allocated memory */
    if (lppArgv)
    {
        free(*lppArgv);
        free(lppArgv);
    }

    return palError;
}